

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CosineDifferentiationTest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  int __x;
  char *extraout_XMM0_Qa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Variable x;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined1 uVar1;
  Variable *in_stack_ffffffffffffff30;
  char *__lhs;
  Variable *in_stack_ffffffffffffff58;
  Variable *in_stack_ffffffffffffff70;
  BaseExpression *in_stack_ffffffffffffff78;
  
  Kandinsky::Variable::Variable((Variable *)0x11d4d3);
  Kandinsky::Variable::setValue
            (in_stack_ffffffffffffff30,
             (double)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  Kandinsky::cos<Kandinsky::Variable,_nullptr>(in_stack_ffffffffffffff58);
  Kandinsky::BaseExpression::differentiate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  Kandinsky::Expression::evaluate((Expression *)0x11d524);
  __x = 3;
  std::sin<int>(0);
  std::abs(__x);
  uVar1 = (double)extraout_XMM0_Qa < 0.0001;
  __lhs = extraout_XMM0_Qa;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)std::sin<int>(0);
  std::__cxx11::to_string((double)__lhs);
  std::operator+(__lhs,__rhs);
  Kandinsky::assertOrExit
            (SUB81((ulong)__rhs >> 0x38,0),(string *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  Kandinsky::Expression::~Expression((Expression *)0x11d5f2);
  Kandinsky::CosineExpression::~CosineExpression((CosineExpression *)0x11d5fc);
  Kandinsky::Variable::~Variable((Variable *)0x11d614);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    x.setValue(3);
    assertOrExit(std::abs((cos(x)).differentiate(x).evaluate() + std::sin(3)) < 1.e-4, "x = 3; d(cos(x))/dx != " + std::to_string(-std::sin(3)));
    return 0;
}